

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  int iVar1;
  uint uVar2;
  dasm_State *pdVar3;
  int *piVar4;
  int *piVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  uint *puVar19;
  uint *puVar20;
  byte bVar21;
  byte *pbVar22;
  bool bVar23;
  
  pdVar3 = ctx->D;
  lVar13 = 0;
  puVar16 = (uint *)buffer;
  do {
    if (pdVar3->maxsection <= lVar13) {
      return (uint)((uint *)((long)buffer + pdVar3->codesize) != puVar16) << 0x19;
    }
    puVar19 = (uint *)pdVar3->sections[lVar13].buf;
    iVar1 = pdVar3->sections[lVar13].pos;
    piVar4 = pdVar3->sections[lVar13].rbuf;
switchD_00105da4_caseD_fe:
    if (puVar19 != (uint *)(piVar4 + iVar1)) {
      pbVar22 = pdVar3->actionlist + (int)*puVar19;
      puVar18 = (uint *)0x0;
      puVar19 = puVar19 + 1;
switchD_00105da4_caseD_fd:
      puVar17 = puVar18;
      pbVar11 = pbVar22;
      bVar14 = *pbVar11;
      uVar7 = 0;
      if ((byte)(bVar14 + 0x17) < 0x12) {
        uVar7 = *puVar19;
        puVar19 = puVar19 + 1;
      }
      pbVar22 = pbVar11 + 1;
      if (bVar14 - 0xe9 < 0x17) break;
      goto LAB_00106028;
    }
    lVar13 = lVar13 + 1;
  } while( true );
  cVar6 = (char)uVar7;
  iVar15 = (int)puVar16;
  puVar18 = puVar16;
  puVar20 = puVar19;
  switch((uint)bVar14) {
  case 0xe9:
    puVar18 = puVar17;
    if (puVar17 == (uint *)0x0) {
      puVar18 = puVar16;
    }
    puVar17 = (uint *)0x0;
    if ((*pbVar22 & 0xfe) == 0xee) {
      puVar17 = puVar18;
    }
    if (uVar7 == 0) {
      bVar14 = *(byte *)((long)puVar18 + -1);
      bVar21 = bVar14 & 7;
      if (bVar21 == 4) {
        bVar21 = (byte)*puVar18 & 7;
      }
      if (bVar21 != 5) {
        *(byte *)((long)puVar18 + -1) = bVar14 + 0x80;
        puVar18 = puVar17;
        goto switchD_00105da4_caseD_fd;
      }
    }
    else {
      if ((int)cVar6 != uVar7) break;
      bVar14 = *(byte *)((long)puVar18 + -1);
    }
    *(byte *)((long)puVar18 + -1) = bVar14 - 0x40;
    goto LAB_001060e5;
  default:
    goto LAB_001060e5;
  case 0xec:
    goto switchD_00105da4_caseD_ec;
  case 0xed:
    break;
  case 0xee:
    if ((int)cVar6 == uVar7) {
LAB_0010600b:
      if (puVar17 == (uint *)0x0) {
        puVar17 = puVar16;
      }
      *(byte *)((long)puVar17 + -2) = *(byte *)((long)puVar17 + -2) + 2;
      puVar17 = (uint *)0x0;
      goto LAB_001060e5;
    }
    puVar17 = (uint *)0x0;
    goto switchD_00105da4_caseD_ec;
  case 0xef:
    if ((int)cVar6 == uVar7) goto LAB_0010600b;
    puVar17 = (uint *)0x0;
    break;
  case 0xf0:
    bVar14 = pbVar11[1];
    puVar18 = (uint *)((long)puVar16 - (ulong)(bVar14 & 7));
    if (((uVar7 & 8) == 0) || (0x9f < bVar14)) {
      if ((uVar7 & 0x10) != 0) {
        if ((char)(byte)*puVar18 < '\0') {
          *(byte *)puVar18 = 0xc5;
          *(byte *)((long)puVar18 + 1) =
               *(byte *)((long)puVar18 + 1) & 0x80 | *(byte *)((long)puVar18 + 2);
          puVar18 = (uint *)((long)puVar18 + 2);
        }
        while (puVar20 = (uint *)((long)puVar18 + 1), puVar20 < puVar16) {
          *(byte *)puVar18 = *(byte *)puVar20;
          puVar18 = puVar20;
        }
        if (puVar17 != (uint *)0x0) {
          puVar17 = (uint *)((long)puVar17 + -1);
        }
        puVar16 = (uint *)((long)puVar16 + -1);
        uVar7 = uVar7 & 7;
      }
      if (bVar14 < 0xc0) goto LAB_00106109;
      uVar7 = uVar7 << 4;
    }
    else {
      if ((char)(byte)*puVar18 < '\0') {
        *(byte *)((long)puVar18 + 1) = *(byte *)((long)puVar18 + 1) ^ ' ' << (bVar14 >> 6);
      }
      else {
        *(byte *)puVar18 = (byte)*puVar18 ^ '\x01' << (bVar14 >> 6);
      }
      uVar7 = uVar7 & 7;
LAB_00106109:
      if (bVar14 < 0x40) {
        if ((uVar7 == 4) && (bVar14 < 0x20)) {
          *(byte *)((long)puVar16 + -1) = *(byte *)((long)puVar16 + -1) ^ 4;
          *(byte *)puVar16 = 0x20;
          puVar16 = (uint *)((long)puVar16 + 1);
          uVar7 = 4;
        }
      }
      else {
        uVar7 = uVar7 << 3;
      }
    }
    *(byte *)((long)puVar16 + -1) = *(byte *)((long)puVar16 + -1) ^ (byte)uVar7;
    goto LAB_00106131;
  case 0xf1:
    bVar14 = *pbVar22;
    while (bVar23 = uVar7 != 0, uVar7 = uVar7 - 1, bVar23) {
      *(byte *)puVar16 = bVar14;
      puVar16 = (uint *)((long)puVar16 + 1);
    }
    goto LAB_00106131;
  case 0xf2:
  case 0xf9:
    goto switchD_00105da4_caseD_f2;
  case 0xf3:
    goto LAB_0010603b;
  case 0xf4:
    pbVar22 = pbVar11 + 2;
    if (-1 < (int)uVar7) goto LAB_00105ee7;
    puVar19 = puVar19 + 1;
    uVar7 = *(uint *)(pdVar3->globals + -uVar7);
LAB_0010603b:
    uVar7 = (uVar7 - iVar15) - 4;
    break;
  case 0xf5:
LAB_00105ee7:
    puVar20 = puVar19 + 1;
    piVar5 = pdVar3->sections[(int)uVar7 >> 0x18].rbuf;
    iVar8 = piVar5[(int)uVar7];
    if (iVar8 < 0) {
      uVar7 = piVar5[(long)(int)uVar7 + 1];
      puVar19 = puVar20;
      goto LAB_0010603b;
    }
    uVar2 = *puVar19;
    uVar7 = (uVar2 + ((int)buffer - iVar15) + iVar8) - 4;
    puVar19 = puVar20;
    if (uVar2 != 0) {
      if (uVar2 == 4) {
        *(byte *)((long)puVar16 + -2) = *(byte *)((long)puVar16 + -1) - 0x10;
        puVar16 = (uint *)((long)puVar16 + -1);
      }
      else {
        *(byte *)((long)puVar16 + -1) = 0xeb;
      }
LAB_001060e5:
      *(byte *)puVar16 = (byte)uVar7;
      puVar16 = (uint *)((long)puVar16 + 1);
      puVar18 = puVar17;
      puVar19 = puVar20;
      goto switchD_00105da4_caseD_fd;
    }
    break;
  case 0xf6:
    pbVar22 = pbVar11 + 2;
    if (-1 < (int)uVar7) goto switchD_00105da4_caseD_f7;
    uVar7 = *(uint *)(pdVar3->globals + -uVar7);
    break;
  case 0xf7:
switchD_00105da4_caseD_f7:
    piVar5 = pdVar3->sections[(int)uVar7 >> 0x18].rbuf;
    iVar15 = piVar5[(int)uVar7];
    if (iVar15 < 0) {
      uVar7 = piVar5[(long)(int)uVar7 + 1];
    }
    else {
      uVar7 = iVar15 + (int)buffer;
    }
    break;
  case 0xf8:
    pbVar22 = pbVar11 + 2;
    puVar18 = puVar17;
    if ((ulong)pbVar11[1] < 10) goto switchD_00105da4_caseD_fd;
    if (pbVar11[2] == 0xf2) {
      uVar7 = *puVar19;
    }
    pdVar3->globals[pbVar11[1]] = (void *)((long)(int)uVar7 + (long)buffer);
    goto LAB_00106131;
  case 0xfa:
    bVar14 = *pbVar22;
    for (lVar12 = (long)puVar16 - (long)buffer; ((uint)lVar12 & (uint)bVar14) != 0;
        lVar12 = lVar12 + 1) {
      *(byte *)puVar16 = 0x90;
      puVar16 = (uint *)((long)puVar16 + 1);
    }
LAB_00106131:
    pbVar22 = pbVar11 + 2;
    puVar18 = puVar17;
    goto switchD_00105da4_caseD_fd;
  case 0xfb:
    iVar8 = ctx->nreloc;
    if (199 < iVar8) {
      fwrite("Error: too many relocations, increase BUILD_MAX_RELOC.\n",0x37,1,_stderr);
      exit(1);
    }
    bVar14 = *pbVar22;
    bVar21 = pbVar11[2];
    iVar10 = relocmap[bVar21];
    if (iVar10 < 0) {
      relocmap[bVar21] = ctx->nrelocsym;
      pcVar9 = sym_decorate(ctx,"",extnames[bVar21]);
      iVar8 = ctx->nrelocsym;
      ctx->relocsym[iVar8] = pcVar9;
      ctx->nrelocsym = iVar8 + 1;
      iVar8 = ctx->nreloc;
      iVar10 = relocmap[bVar21];
    }
    ctx->reloc[iVar8].ofs = iVar15 - *(int *)&ctx->code;
    ctx->reloc[iVar8].sym = iVar10;
    ctx->reloc[iVar8].type = (uint)bVar14;
    ctx->nreloc = iVar8 + 1;
    pbVar22 = pbVar11 + 3;
    uVar7 = 0;
    break;
  case 0xfc:
    bVar14 = pbVar11[1];
    pbVar22 = pbVar11 + 2;
LAB_00106028:
    *(byte *)puVar16 = bVar14;
    puVar16 = (uint *)((long)puVar16 + 1);
    goto switchD_00105da4_caseD_f2;
  case 0xfd:
    goto switchD_00105da4_caseD_fd;
  case 0xfe:
  case 0xff:
    goto switchD_00105da4_caseD_fe;
  }
  *puVar16 = uVar7;
  puVar16 = puVar16 + 1;
switchD_00105da4_caseD_f2:
  puVar18 = puVar17;
  goto switchD_00105da4_caseD_fd;
switchD_00105da4_caseD_ec:
  *(short *)puVar16 = (short)uVar7;
  puVar16 = (uint *)((long)puVar16 + 2);
  goto switchD_00105da4_caseD_f2;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n];
	  /* fallthrough */
	case DASM_REL_A: rel_a: n -= (int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++; if (n < 0) { n = (int)(ptrdiff_t)D->globals[-n]; goto wd; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  n = *pb < 0 ? pb[1] : (*pb + (int)(ptrdiff_t)base);
	  goto wd;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}